

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_ReplaceItemViaPointer(cJSON *parent,cJSON *item,cJSON *replacement)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON **ppcVar3;
  
  if (item == (cJSON *)0x0) {
    return 0;
  }
  if (parent == (cJSON *)0x0) {
    return 0;
  }
  if (replacement == (cJSON *)0x0) {
    return 0;
  }
  if (replacement == item) {
    return 1;
  }
  pcVar2 = item->next;
  replacement->next = pcVar2;
  replacement->prev = item->prev;
  if (pcVar2 != (cJSON *)0x0) {
    pcVar2->prev = replacement;
  }
  pcVar1 = parent->child;
  if (pcVar1 == item) {
    ppcVar3 = &parent->child;
    if (pcVar1->prev == item) {
      replacement->prev = replacement;
    }
  }
  else {
    if (replacement->prev != (cJSON *)0x0) {
      replacement->prev->next = replacement;
      pcVar2 = replacement->next;
    }
    if (pcVar2 != (cJSON *)0x0) goto LAB_00104e38;
    ppcVar3 = &pcVar1->prev;
  }
  *ppcVar3 = replacement;
LAB_00104e38:
  item->next = (cJSON *)0x0;
  item->prev = (cJSON *)0x0;
  cJSON_Delete(item);
  return 1;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_ReplaceItemViaPointer(cJSON * const parent, cJSON * const item, cJSON * replacement)
{
    if ((parent == NULL) || (replacement == NULL) || (item == NULL))
    {
        return false;
    }

    if (replacement == item)
    {
        return true;
    }

    replacement->next = item->next;
    replacement->prev = item->prev;

    if (replacement->next != NULL)
    {
        replacement->next->prev = replacement;
    }
    if (parent->child == item)
    {
        if (parent->child->prev == parent->child)
        {
            replacement->prev = replacement;
        }
        parent->child = replacement;
    }
    else
    {   /*
         * To find the last item in array quickly, we use prev in array.
         * We can't modify the last item's next pointer where this item was the parent's child
         */
        if (replacement->prev != NULL)
        {
            replacement->prev->next = replacement;
        }
        if (replacement->next == NULL)
        {
            parent->child->prev = replacement;
        }
    }

    item->next = NULL;
    item->prev = NULL;
    cJSON_Delete(item);

    return true;
}